

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

VariableSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,char (*args) [5],SourceLocation *args_1,VariableLifetime *args_2)

{
  size_t sVar1;
  VariableSymbol *this_00;
  string_view name;
  
  this_00 = (VariableSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariableSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (VariableSymbol *)allocateSlow(this,0x158,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  sVar1 = strlen(*args);
  name._M_str = *args;
  name._M_len = sVar1;
  ast::VariableSymbol::VariableSymbol(this_00,name,*args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }